

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationRootElements::findPrimary(CollationRootElements *this,uint32_t p)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  long lVar9;
  uint32_t *puVar10;
  bool bVar11;
  
  puVar1 = this->elements;
  uVar2 = puVar1[2];
  uVar3 = this->length - 1;
  do {
    if ((int)uVar3 <= (int)(uVar2 + 1)) {
      return uVar2;
    }
    uVar4 = (int)(uVar3 + uVar2) / 2;
    uVar6 = puVar1[(int)uVar4];
    if ((char)uVar6 < '\0') {
      if (uVar4 + 1 != uVar3) {
        lVar9 = (long)(int)(uVar4 + 1);
        do {
          uVar6 = puVar1[lVar9];
          if (-1 < (char)uVar6) {
            uVar4 = (uint32_t)lVar9;
            break;
          }
          lVar9 = lVar9 + 1;
        } while (uVar3 != (uint32_t)lVar9);
      }
      if ((char)uVar6 < '\0') {
        uVar7 = uVar4 - 1;
        uVar5 = uVar4;
        if (uVar7 != uVar2) {
          puVar10 = puVar1 + (long)(int)uVar4 + -1;
          do {
            uVar6 = *puVar10;
            uVar5 = uVar7;
            if (-1 < (char)uVar6) break;
            uVar7 = uVar7 - 1;
            puVar10 = puVar10 + -1;
            uVar5 = uVar4;
          } while (uVar2 != uVar7);
        }
        bVar11 = -1 < (char)uVar6;
        uVar8 = (uint)(int)(char)uVar6 >> 7 & 3;
        uVar4 = uVar5;
      }
      else {
        uVar8 = 0;
        bVar11 = true;
      }
      if (bVar11) goto LAB_00247307;
    }
    else {
LAB_00247307:
      if (p < (uVar6 & 0xffffff00)) {
        uVar3 = uVar4;
        uVar4 = uVar2;
      }
      uVar2 = uVar4;
      uVar8 = 0;
    }
    if (uVar8 != 0) {
      return uVar2;
    }
  } while( true );
}

Assistant:

int32_t
CollationRootElements::findPrimary(uint32_t p) const {
    // Requirement: p must occur as a root primary.
    U_ASSERT((p & 0xff) == 0);  // at most a 3-byte primary
    int32_t index = findP(p);
    // If p is in a range, then we just assume that p is an actual primary in this range.
    // (Too cumbersome/expensive to check.)
    // Otherwise, it must be an exact match.
    U_ASSERT(isEndOfPrimaryRange(elements[index + 1]) || p == (elements[index] & 0xffffff00));
    return index;
}